

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_abs_h(CPUTriCoreState *env,target_ulong_conflict arg)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  
  uVar3 = 0;
  uVar5 = 0;
  uVar6 = 0;
  sVar4 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    uVar8 = (int)(arg << (0x10U - sVar4 & 0x1f)) >> 0x10;
    uVar1 = -uVar8;
    if (0 < (int)uVar8) {
      uVar1 = uVar8;
    }
    uVar6 = uVar6 | 0x7fff < uVar1;
    uVar5 = uVar5 | uVar1 * 2 ^ uVar1;
    uVar3 = uVar3 | uVar1 << sVar4;
    sVar4 = 0x10;
    bVar2 = false;
  } while (bVar7);
  env->PSW_USB_V = uVar6 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar6 << 0x1f;
  env->PSW_USB_AV = uVar5 << 0x10;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar5 << 0x10;
  return uVar3;
}

Assistant:

uint32_t helper_abs_h(CPUTriCoreState *env, target_ulong arg)
{
    int32_t h, i;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 2; i++) {
        h = sextract32(arg, i * 16, 16);
        h = (h >= 0) ? h : (0 - h);
        ovf |= (h > 0x7FFF) || (h < -0x8000);
        avf |= h ^ h * 2u;
        ret |= (h & 0xffff) << (i * 16);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 16;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}